

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLCommonTest_clearTextTest_Test::TestBody
          (OpenDDLCommonTest_clearTextTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  Message local_90;
  undefined4 local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  Text *theText;
  OpenDDLCommonTest_clearTextTest_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLCommonTest::createTestText(&this->super_OpenDDLCommonTest);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_28,
             gtest_ar_.message_.ptr_ !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"nullptr != theText","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    Text::clear((Text *)gtest_ar_.message_.ptr_);
    local_84 = 0;
    pcVar2 = (char *)0x0;
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              ((char *)local_80,"0U",(uint *)"theText->m_len",(unsigned_long *)&local_84,
               &(gtest_ar_.message_.ptr_)->_M_string_length);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
                 ,0x6c,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)local_a8,
               ((gtest_ar_.message_.ptr_)->field_2)._M_allocated_capacity == 0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_d8,(internal *)local_a8,(AssertionResult *)"nullptr == theText->m_buffer",
                 "false","true",pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLCommonTest.cpp"
                 ,0x6d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  }
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, clearTextTest) {
    Text *theText = createTestText();
    ASSERT_TRUE(nullptr != theText);

    theText->clear();
    EXPECT_EQ(0U, theText->m_len);
    EXPECT_TRUE(nullptr == theText->m_buffer);
}